

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.hpp
# Opt level: O1

void __thiscall
duckdb::Logger::
WriteLog<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,unsigned_long,std::__cxx11::string,unsigned_long>
          (Logger *this,char *log_type,LogLevel log_level,char *format_string,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_2,
          unsigned_long params_3,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_4,
          unsigned_long params_5)

{
  pointer pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_4_00;
  undefined8 in_stack_ffffffffffffff08;
  _Alloc_hider _Var2;
  size_type in_stack_ffffffffffffff18;
  undefined8 in_stack_ffffffffffffff20;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  string formatted_string;
  
  ::std::__cxx11::string::string
            ((string *)local_70,format_string,(allocator *)&stack0xffffffffffffff0f);
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  pcVar1 = (params->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,pcVar1,pcVar1 + params->_M_string_length);
  _Var2._M_p = &stack0xffffffffffffff20;
  pcVar1 = (params_1->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xffffffffffffff10,pcVar1,pcVar1 + params_1->_M_string_length);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,*(long *)params_2._M_dataplus._M_p,
             *(long *)(params_2._M_dataplus._M_p + 8) + *(long *)params_2._M_dataplus._M_p);
  local_90[0] = local_80;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_90,*(long *)params_2.field_2._M_allocated_capacity,
             *(long *)(params_2.field_2._M_allocated_capacity + 8) +
             *(long *)params_2.field_2._M_allocated_capacity);
  params_4_00._M_string_length = in_stack_ffffffffffffff08;
  params_4_00._M_dataplus._M_p = (pointer)params_2.field_2._8_8_;
  params_4_00.field_2._M_allocated_capacity = (size_type)_Var2._M_p;
  params_4_00.field_2._8_8_ = in_stack_ffffffffffffff18;
  StringUtil::
  Format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,unsigned_long,std::__cxx11::string,unsigned_long>
            (&formatted_string,(StringUtil *)local_70,&local_d0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xffffffffffffff10,&local_b0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             params_2._M_string_length,(unsigned_long)local_90,params_4_00,in_stack_ffffffffffffff20
            );
  if (local_90[0] != local_80) {
    operator_delete(local_90[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if (_Var2._M_p != &stack0xffffffffffffff20) {
    operator_delete(_Var2._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  (*this->_vptr_Logger[3])(this,log_type,(ulong)log_level,formatted_string._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)formatted_string._M_dataplus._M_p != &formatted_string.field_2) {
    operator_delete(formatted_string._M_dataplus._M_p);
  }
  return;
}

Assistant:

void WriteLog(const char *log_type, LogLevel log_level, const char *format_string, ARGS... params) {
		auto formatted_string = StringUtil::Format(format_string, params...);
		WriteLog(log_type, log_level, formatted_string.c_str());
	}